

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O0

void AudioBackend_StopSound(AudioBackend_Sound *sound)

{
  AudioBackend_Sound *sound_local;
  
  if (sound != (AudioBackend_Sound *)0x0) {
    ma_mutex_lock(&mutex);
    sound->playing = false;
    sound->position = 0.0;
    ma_mutex_unlock(&mutex);
  }
  return;
}

Assistant:

void AudioBackend_StopSound(AudioBackend_Sound *sound)
{
	if (sound == NULL)
		return;

	ma_mutex_lock(&mutex);

	sound->playing = FALSE;
	sound->position = 0.0;

	ma_mutex_unlock(&mutex);
}